

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurlHandle.cpp
# Opt level: O0

int __thiscall
curlpp::internal::CurlHandle::executeProgressFunctor
          (CurlHandle *this,double dltotal,double dlnow,double ultotal,double ulnow)

{
  bool bVar1;
  CurlHandle *this_00;
  CallbackExceptionBase *e;
  LogicError *in_stack_ffffffffffffff68;
  CallbackException<curlpp::LogicError> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  Functor<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
  *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffffb8;
  LogicError *in_stack_ffffffffffffffc0;
  undefined4 local_4;
  
  bVar1 = utilspp::
          Functor<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
          ::operator!((Functor<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
                       *)0x14e333);
  if (bVar1) {
    this_00 = (CurlHandle *)operator_new(0x20);
    LogicError::LogicError(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    CallbackException<curlpp::LogicError>::CallbackException
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    setException(this_00,(CallbackExceptionBase *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    LogicError::~LogicError((LogicError *)0x14e392);
    local_4 = 0x2a;
  }
  else {
    local_4 = utilspp::
              Functor<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
              ::operator()(in_stack_ffffffffffffff80,
                           (Parm1)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           (Parm2)in_stack_ffffffffffffff70,(Parm3)in_stack_ffffffffffffff68,
                           6.76426263852542e-318);
  }
  return local_4;
}

Assistant:

int
CurlHandle::executeProgressFunctor(double dltotal, 
																	 double dlnow, 
																	 double ultotal, 
																	 double ulnow)
{
	if (!mProgressFunctor)
	{
		setException(new CallbackException<curlpp::LogicError>(curlpp::LogicError("Null write functor")));
		return CURLE_ABORTED_BY_CALLBACK;
	}

	try
	{
		return mProgressFunctor(dltotal, dlnow, ultotal, ulnow);
	}

	catch(curlpp::CallbackExceptionBase * e)
	{
		setException(e);
	}

	catch(...)
	{
		setException(new CallbackException<curlpp::UnknowException>(curlpp::UnknowException()));
	}

	return CURLE_ABORTED_BY_CALLBACK;
}